

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

char * Catch::toString_abi_cxx11_(float value)

{
  char *in_RDI;
  int in_stack_00000198;
  float in_stack_0000019c;
  char *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30 [48];
  
  __lhs = local_30;
  __rhs = in_RDI;
  fpToString<float>(in_stack_0000019c,in_stack_00000198);
  std::operator+(__lhs,__rhs);
  std::__cxx11::string::~string((string *)local_30);
  return in_RDI;
}

Assistant:

std::string toString( const float value ) {
    return fpToString( value, 5 ) + "f";
}